

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12dGPUResourceULT.cpp
# Opt level: O3

void __thiscall
CTestGen12dGPUResource_TestPlanarTile64CompressedResource_Test::
~CTestGen12dGPUResource_TestPlanarTile64CompressedResource_Test
          (CTestGen12dGPUResource_TestPlanarTile64CompressedResource_Test *this)

{
  CTestGen9Resource::~CTestGen9Resource((CTestGen9Resource *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(CTestGen12dGPUResource, TestPlanarTile64CompressedResource)
{

    const uint32_t TileSize[TEST_BPP_MAX][2] = {
    {256, 256}, {512, 128}, {512, 128}, {1024, 64}, {1024, 64}}; // TileYS

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_2D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.Flags.Gpu.MMC        = 1;
    //gmmParams.Flags.Gpu.CCS = 1;
    gmmParams.Flags.Gpu.UnifiedAuxSurface = 1;
    gmmParams.Flags.Info.MediaCompressed  = 1;
    gmmParams.BaseWidth64                 = 0x64;
    gmmParams.BaseHeight                  = 0x64;
    gmmParams.Depth                       = 0x1;
    gmmParams.ArraySize                   = 2;

    GMM_RESOURCE_FORMAT Format[4] = {GMM_FORMAT_NV12, GMM_FORMAT_NV21, GMM_FORMAT_P010, GMM_FORMAT_P016};
    for(auto fmt : Format)
    {
        gmmParams.Format = fmt; // 8bpp(NV12) , P016 (16bpp), P010 (16bpp), NV21(8bpp)

        TEST_BPP Ybpp, UVbpp;
        //could be accessed on CPU/app where UV plane bpp is double
        switch(pGmmULTClientContext->GetPlatformInfo().FormatTable[gmmParams.Format].Element.BitsPer)
        {
            case 8:
                Ybpp  = TEST_BPP_8;
                UVbpp = TEST_BPP_16;
                break;
            case 16:
                Ybpp  = TEST_BPP_16;
                UVbpp = TEST_BPP_32;
                break;
            default:
                return;
        }

        gmmParams.Flags.Gpu.UnifiedAuxSurface = 1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);
	
	GMM_REQ_OFFSET_INFO OffsetInfo = {};

        OffsetInfo.ReqLock             = 1;
        OffsetInfo.ReqRender           = 1;
        OffsetInfo.Plane               = GMM_PLANE_Y;
        OffsetInfo.ArrayIndex          = 1;
        OffsetInfo.ReqStdLayout        = 0;
        ResourceInfo->GetOffset(OffsetInfo);
         
	// ToDo: add verification
        //{ //separate Aux
        //    gmmParams.Flags.Gpu.UnifiedAuxSurface = 0;
	//    GMM_RESOURCE_INFO *AuxResourceInfo;
        //    AuxResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);
        //    EXPECT_EQ(ResourceInfo->GetSizeAuxSurface(GMM_AUX_CCS), AuxResourceInfo->G

        // add verification

        //{ //separate Aux
        //    gmmParams.Flags.Gpu.UnifiedAuxSurface = 0;

        //    GMM_RESOURCE_INFO *AuxResourceInfo;
        //    AuxResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        //    EXPECT_EQ(ResourceInfo->GetSizeAuxSurface(GMM_AUX_CCS), AuxResourceInfo->GetSizeSurface());

        //    pGmmULTClientContext->DestroyResInfoObject(AuxResourceInfo);
        //}

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}